

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *name)

{
  char *pcVar1;
  double dVar2;
  undefined1 local_38 [8];
  stringc c;
  SAttribute *attr;
  char *name_local;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  c._8_8_ = getAttributeByName(this,name);
  if ((SAttribute *)c._8_8_ == (SAttribute *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    pcVar1 = core::string<char>::c_str(&((SAttribute *)c._8_8_)->Value);
    core::string<char>::string<char>((string<char> *)local_38,pcVar1);
    pcVar1 = core::string<char>::c_str((string<char> *)local_38);
    dVar2 = atof(pcVar1);
    this_local._4_4_ = (float)dVar2;
    core::string<char>::~string((string<char> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

float getAttributeValueAsFloat(const char_type* name) const
	{
		const SAttribute* attr = getAttributeByName(name);
		if (!attr)
			return 0;

		core::stringc c = attr->Value.c_str();
        return static_cast<float>(atof(c.c_str()));
        //return fast_atof(c.c_str());
	}